

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O0

bool __thiscall
stream::inno_lzma2_decompressor_impl::filter
          (inno_lzma2_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  byte *pbVar1;
  bool bVar2;
  undefined8 uVar3;
  lzma_stream *plVar4;
  long in_RDX;
  long *in_RSI;
  lzma_error *in_RDI;
  lzma_options_lzma *in_stack_00000008;
  lzma_vli in_stack_00000010;
  uint8_t prop;
  lzma_options_lzma options;
  string *msg;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff8f;
  char *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  lzma_decompressor_impl_base *in_stack_ffffffffffffffb0;
  
  if (*(long *)in_RDI == 0) {
    if (*in_RSI == in_RDX) {
      return true;
    }
    pbVar1 = (byte *)*in_RSI;
    *in_RSI = (long)(pbVar1 + 1);
    if (0x28 < *pbVar1) {
      uVar3 = __cxa_allocate_exception(0x28);
      msg = (string *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      lzma_error::lzma_error(in_RDI,msg,(int)((ulong)uVar3 >> 0x20));
      __cxa_throw(uVar3,&lzma_error::typeinfo,slice_error::~slice_error);
    }
    plVar4 = init_raw_lzma_stream(in_stack_00000010,in_stack_00000008);
    *(lzma_stream **)in_RDI = plVar4;
  }
  bVar2 = lzma_decompressor_impl_base::filter
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (bool)in_stack_ffffffffffffff8f);
  return bVar2;
}

Assistant:

bool inno_lzma2_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		if(begin_in == end_in) {
			return true;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t prop = boost::uint8_t(*begin_in++);
		if(prop > 40) {
			throw lzma_error("inno lzma2 property error", LZMA_FORMAT_ERROR);
		}
		
		if(prop == 40) {
			options.dict_size = 0xffffffff;
		} else {
			options.dict_size = ((boost::uint32_t(2) | boost::uint32_t((prop) & 1)) << ((prop) / 2 + 11));
		}
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA2, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}